

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ReshapeLikeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reshapelike(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x46f) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x46f;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    ReshapeLikeLayerParams::ReshapeLikeLayerParams(this_00.reshapelike_);
    (this->layer_).reshapelike_ = (ReshapeLikeLayerParams *)this_00;
  }
  return (ReshapeLikeLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ReshapeLikeLayerParams* NeuralNetworkLayer::mutable_reshapelike() {
  if (!has_reshapelike()) {
    clear_layer();
    set_has_reshapelike();
    layer_.reshapelike_ = new ::CoreML::Specification::ReshapeLikeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reshapeLike)
  return layer_.reshapelike_;
}